

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O1

int set_insert(set s,set_key key,set_value value)

{
  ulong uVar1;
  bucket pbVar2;
  int iVar3;
  hash hVar4;
  pair ppVar5;
  size_t line;
  char *message;
  
  if ((key == (set_key)0x0 || s == (set)0x0) || value == (set_value)0x0) {
    message = "Invalid set insertion parameters";
    line = 0xcc;
  }
  else {
    hVar4 = (*s->hash_cb)(key);
    uVar1 = s->capacity;
    pbVar2 = s->buckets;
    ppVar5 = bucket_get_pair(pbVar2 + hVar4 % uVar1,s->compare_cb,key);
    if (ppVar5 != (pair)0x0) {
      ppVar5->value = value;
      return 0;
    }
    iVar3 = bucket_insert(pbVar2 + hVar4 % uVar1,key,value);
    if (iVar3 == 0) {
      s->count = s->count + 1;
      iVar3 = set_bucket_realloc(s);
      return iVar3;
    }
    message = "Invalid set bucket insertion";
    line = 0xe0;
  }
  log_write_impl_va("metacall",line,"set_insert",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                    ,LOG_LEVEL_ERROR,message);
  return 1;
}

Assistant:

int set_insert(set s, set_key key, set_value value)
{
	set_hash h;
	size_t index;
	bucket b;
	pair p;

	if (s == NULL || key == NULL || value == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid set insertion parameters");
		return 1;
	}

	h = s->hash_cb(key);

	index = h % s->capacity;

	b = &s->buckets[index];

	p = bucket_get_pair(b, s->compare_cb, key);

	if (p != NULL)
	{
		p->value = value;
		return 0;
	}

	if (bucket_insert(b, key, value) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid set bucket insertion");
		return 1;
	}

	++s->count;

	return set_bucket_realloc(s);
}